

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGraph.cpp
# Opt level: O2

void __thiscall Hpipe::InstructionGraph::train(InstructionGraph *this,bool only_cont)

{
  undefined7 in_register_00000031;
  pointer pTVar1;
  size_type s;
  undefined4 local_9c;
  Vec<Hpipe::Lexer::TrainingData> tds;
  size_type m;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  string inp;
  
  local_9c = (undefined4)CONCAT71(in_register_00000031,only_cont);
  CharGraph::training_data(&tds,this->cg);
  if (tds.super_vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>.
      super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      tds.super_vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>.
      super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    local_60 = std::
               _Function_handler<void_(Hpipe::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/hleclerc[P]Hpipe/src/Hpipe/InstructionGraph.cpp:459:22)>
               ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(Hpipe::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/hleclerc[P]Hpipe/src/Hpipe/InstructionGraph.cpp:459:22)>
               ::_M_manager;
    Instruction::apply(this->init,(function<void_(Hpipe::Instruction_*)> *)&local_78,true);
    std::_Function_base::~_Function_base((_Function_base *)&local_78);
    for (pTVar1 = tds.
                  super_vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>
                  .
                  super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pTVar1 != tds.
                  super_vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>
                  .
                  super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pTVar1 = pTVar1 + 1) {
      std::__cxx11::string::string((string *)&inp,(string *)&pTVar1->inp);
      s = 0;
      if ((char)local_9c == '\0') {
        Instruction::train_rec(this->init,&s,&m,&inp,pTVar1->freq,false);
      }
      s = 0;
      Instruction::train_rec(this->init,&s,&m,&inp,pTVar1->freq,true);
      std::__cxx11::string::~string((string *)&inp);
    }
  }
  std::vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>::~vector
            (&tds.
              super_vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>)
  ;
  return;
}

Assistant:

void InstructionGraph::train( bool only_cont ) {
    Vec<Lexer::TrainingData> tds = cg->training_data();
    if ( tds.size() ) {
        init->apply( []( Instruction *inst ) {
            for( Transition &t : inst->next )
                t.freq = 0.0;
            inst->freq.assign( 256, 0.0 );
            inst->cum_freq = 0.0;
        }, true );

        for( const Lexer::TrainingData &td : tds ) {
            const std::string inp = td.inp;
            // without contiguous data
            std::string::size_type s = 0, m;
            if ( not only_cont ) {
                init->train_rec( s, m, inp, td.freq, false );
                // with contiguous data
                s = 0;
            }
            init->train_rec( s, m, inp, td.freq, true );
        }
    }
}